

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Token *token)

{
  Token *pTVar1;
  TokenType TVar2;
  char cVar3;
  NumericConstant *this;
  string local_68;
  string local_38;
  Token *local_18;
  Token *token_local;
  ostream *os_local;
  
  local_18 = token;
  token_local = (Token *)os;
  TVar2 = Token::type(token);
  pTVar1 = token_local;
  switch(TVar2) {
  case NUMBER:
    this = Token::numericValue(local_18);
    NumericConstant::toString_abi_cxx11_(&local_38,this);
    std::operator<<((ostream *)pTVar1,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    break;
  case OPERATOR:
    cVar3 = Token::charValue(local_18);
    std::operator<<((ostream *)pTVar1,cVar3);
    break;
  default:
    break;
  case IDENTIFIER:
    Token::identifier_abi_cxx11_(&local_68,local_18);
    std::operator<<((ostream *)pTVar1,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    break;
  case LEFT_PARENTHESIS:
    std::operator<<((ostream *)token_local,"(");
    break;
  case RIGHT_PARENTHESIS:
    std::operator<<((ostream *)token_local,")");
    break;
  case COMMA:
    std::operator<<((ostream *)token_local,",");
  }
  return (ostream *)token_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Token& token) {
	switch (token.type()) {
		case TokenType::NUMBER:
			os << token.numericValue().toString();
			break;
		case TokenType::OPERATOR:
			os << token.charValue();
			break;
		case TokenType::IDENTIFIER:
			os << token.identifier();
			break;
		case TokenType::LEFT_PARENTHESIS:
			os << "(";
			break;
		case TokenType::RIGHT_PARENTHESIS:
			os << ")";
			break;
		case TokenType::COMMA:
			os << ",";
			break;
		default:
			break;
	}

	return os;
}